

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

void UpdateAllSourceProps(ALCcontext *context)

{
  iterator __first;
  span<Voice_*,_18446744073709551615UL> voicelist;
  lock_guard<std::mutex> _;
  mutex_type *in_stack_ffffffffffffffa8;
  span<Voice_*,_18446744073709551615UL> *this;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  anon_class_8_1_bc11688f in_stack_ffffffffffffffb8;
  ALCcontext *in_stack_ffffffffffffffc8;
  span<Voice_*,_18446744073709551615UL> local_20 [2];
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_20[0] = ALCcontext::getVoicesSpan(in_stack_ffffffffffffffc8);
  this = local_20;
  __first = al::span<Voice_*,_18446744073709551615UL>::begin(this);
  al::span<Voice_*,_18446744073709551615UL>::end(this);
  std::for_each<Voice**,UpdateAllSourceProps(ALCcontext*)::__0>
            (__first,(Voice **)this,in_stack_ffffffffffffffb8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1717c3);
  return;
}

Assistant:

void UpdateAllSourceProps(ALCcontext *context)
{
    std::lock_guard<std::mutex> _{context->mSourceLock};
    auto voicelist = context->getVoicesSpan();
    std::for_each(voicelist.begin(), voicelist.end(),
        [context](Voice *voice) -> void
        {
            ALuint sid{voice->mSourceID.load(std::memory_order_acquire)};
            ALsource *source = sid ? LookupSource(context, sid) : nullptr;
            if(source && !source->PropsClean.test_and_set(std::memory_order_acq_rel))
                UpdateSourceProps(source, voice, context);
        }
    );
}